

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool operator_string_add(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  gravity_object_t *pgVar4;
  uint uVar5;
  char *s;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar6;
  _Bool _Var7;
  gravity_value_t gVar8;
  char buffer [4096];
  char local_1038 [4104];
  
  pgVar4 = (args->field_1).p;
  gVar8 = convert_value2string(vm,args[1]);
  aVar6 = gVar8.field_1;
  if (gVar8.isa == (gravity_class_t *)0x0) {
    builtin_strncpy(local_1038,"Unable to convert object to String",0x23);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1038);
LAB_0011e1ab:
    _Var7 = false;
    gVar8.field_1.n = 0;
    gVar8.isa = gravity_class_null;
    gravity_vm_setslot(vm,gVar8,rindex);
  }
  else {
    uVar2 = *(uint *)((long)&pgVar4->identifier + 4);
    iVar3 = *(int *)((long)&(aVar6.p)->identifier + 4);
    uVar1 = iVar3 + 1 + uVar2;
    s = local_1038;
    uVar5 = uVar2;
    if (0xfff < uVar1) {
      s = (char *)gravity_calloc(vm,1,(ulong)uVar1);
      if (s == (char *)0x0) goto LAB_0011e1ab;
      uVar5 = *(uint *)((long)&pgVar4->identifier + 4);
    }
    memcpy(s,pgVar4->objclass,(ulong)uVar5);
    memcpy(s + *(uint *)((long)&pgVar4->identifier + 4),(aVar6.p)->objclass,
           (ulong)*(uint *)((long)&(aVar6.p)->identifier + 4));
    gVar8 = gravity_string_to_value(vm,s,iVar3 + uVar2);
    if (s != local_1038) {
      free(s);
    }
    gravity_vm_setslot(vm,gVar8,rindex);
    _Var7 = true;
  }
  return _Var7;
}

Assistant:

static bool operator_string_add (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_STRING(v2, true);

    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    gravity_string_t *s2 = VALUE_AS_STRING(v2);

    uint32_t len = s1->len + s2->len;
    char buffer[4096];
    char *s = NULL;

    // check if I can save an allocation
    if (len+1 < sizeof(buffer)) s = buffer;
    else {
        s = mem_alloc(vm, len+1);
        CHECK_MEM_ALLOC(s);
    }

    memcpy(s, s1->s, s1->len);
    memcpy(s+s1->len, s2->s, s2->len);

    gravity_value_t v = VALUE_FROM_STRING(vm, s, len);
    if (s != NULL && s != buffer) mem_free(s);

    RETURN_VALUE(v, rindex);
}